

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
argstest::
MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
::ParseValue(MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
             *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values_)

{
  type_conflict2 tVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pvVar4;
  string local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream problem;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
  local_58;
  const_iterator it;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  string *value_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values__local;
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
  *this_local;
  
  key.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::at(values_,0);
  std::__cxx11::string::string((string *)local_40);
  tVar1 = ValueReader::operator()
                    ((ValueReader *)&this->field_0x178,
                     &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,
                     (string *)key.field_2._8_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  if (!tVar1) {
    (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.error = Parse;
  }
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>_>
       ::find(&this->map,(key_type *)local_40);
  local_60._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<std::__cxx11::string,MappingEnum,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MappingEnum>>>>
                 (&this->map);
  bVar2 = std::__detail::operator==(&local_58,&local_60);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar3 = std::operator<<((ostream *)local_1d8,"Could not find key \'");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,"\' in map for arg \'");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name
                            );
    std::operator<<(poVar3,"\'");
    (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.error = Map;
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.errorMsg,
               local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  else {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_false,_true>
                           *)&local_58);
    this->value = pvVar4->second;
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value_ = values_.at(0);

                K key;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, key))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, key);
#endif
                auto it = map.find(key);
                if (it == std::end(map))
                {
                    std::ostringstream problem;
                    problem << "Could not find key '" << key << "' in map for arg '" << name << "'";
#ifdef ARGS_NOEXCEPT
                    error = Error::Map;
                    errorMsg = problem.str();
#else
                    throw MapError(problem.str());
#endif
                } else
                {
                    this->value = it->second;
                }
            }